

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.h
# Opt level: O3

JsErrorCode __thiscall AutoString::Initialize(AutoString *this,JsValueRef value)

{
  JsValueRef pvVar1;
  JsErrorCode JVar2;
  char16_t_conflict *format;
  size_t *psVar3;
  char16_t_conflict *string;
  undefined1 auStack_120 [24];
  size_t *psStack_108;
  __va_list_tag _Stack_70;
  code *pcStack_50;
  JsValueType local_44;
  JsValueRef pvStack_40;
  JsValueType type;
  size_t writtenLength;
  JsValueRef strValue;
  size_t length;
  
  this->errorCode = JsNoError;
  pcStack_50 = (code *)0x10ca2f;
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetValueType)(value,&local_44);
  if (local_44 == JsString) {
    JVar2 = this->errorCode;
    writtenLength = (size_t)value;
  }
  else {
    pcStack_50 = (code *)0x10ca4d;
    JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtConvertValueToString)
                      (value,(JsValueRef *)&writtenLength);
    this->errorCode = JVar2;
  }
  strValue = (JsValueRef)0x0;
  if (JVar2 == JsNoError) {
    pcStack_50 = (code *)0x10ca70;
    JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCopyString)
                      ((JsValueRef)writtenLength,(char *)0x0,0,(size_t *)&strValue);
    pvVar1 = strValue;
    this->errorCode = JVar2;
    if (JVar2 == JsNoError) {
      pcStack_50 = (code *)0x10ca84;
      format = (char16_t_conflict *)malloc((long)strValue + 1);
      this->data = (char *)format;
      psVar3 = (size_t *)&stack0xffffffffffffffc0;
      pvStack_40 = (JsValueRef)0x0;
      pcStack_50 = (code *)0x10caa5;
      string = (char16_t_conflict *)writtenLength;
      JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCopyString)
                        ((JsValueRef)writtenLength,(char *)format,(size_t)pvVar1,psVar3);
      this->errorCode = JVar2;
      if (JVar2 == JsNoError) {
        if (strValue != pvStack_40) {
          pcStack_50 = swprintf_s<256ul>;
          Initialize();
          _Stack_70.reg_save_area = auStack_120;
          _Stack_70.overflow_arg_area = &stack0xffffffffffffffc0;
          _Stack_70.gp_offset = 0x10;
          _Stack_70.fp_offset = 0x30;
          psStack_108 = psVar3;
          pcStack_50 = (code *)&stack0xfffffffffffffff8;
          JVar2 = vswprintf_s(string,0x100,format,&_Stack_70);
          return JVar2;
        }
        this->data[(long)strValue] = '\0';
        this->length = (size_t)strValue;
        JVar2 = this->errorCode;
      }
    }
  }
  return JVar2;
}

Assistant:

JsErrorCode Initialize(JsValueRef value)
    {
        errorCode = JsNoError;
        JsValueRef strValue;
        JsValueType type;
        ChakraRTInterface::JsGetValueType(value, &type);
        if (type != JsString)
        {
            errorCode = ChakraRTInterface::JsConvertValueToString(value, &strValue);
        }
        else
        {
            strValue = value;
        }
        size_t length = 0;
        if (errorCode == JsNoError)
        {
            errorCode = ChakraRTInterface::JsCopyString(strValue, nullptr, 0, &length);
            if (errorCode == JsNoError)
            {
                data = (char*)malloc((length + 1) * sizeof(char));
                size_t writtenLength = 0;
                errorCode = ChakraRTInterface::JsCopyString(strValue, data, length, &writtenLength);
                if (errorCode == JsNoError)
                {
                    AssertMsg(length == writtenLength, "Inconsistent length in utf8 encoding");
                }
            }
        }
        if (errorCode == JsNoError)
        {
            *(data + length) = char(0);
            this->length = length;
        }
        return errorCode;
    }